

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

StructDef * __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GetNestedStruct
          (PythonStubGenerator *this,FieldDef *field)

{
  Parser *this_00;
  Value *pVVar1;
  string local_88;
  PythonStubGenerator *local_68;
  StructDef *nested_def;
  allocator<char> local_49;
  string local_48;
  Value *local_28;
  Value *nested;
  FieldDef *field_local;
  PythonStubGenerator *this_local;
  
  nested = (Value *)field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"nested_flatbuffer",&local_49);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (pVVar1 == (Value *)0x0) {
    this_local = (PythonStubGenerator *)0x0;
  }
  else {
    local_28 = pVVar1;
    local_68 = (PythonStubGenerator *)Parser::LookupStruct(this->parser_,&pVVar1->constant);
    this_local = local_68;
    if (local_68 == (PythonStubGenerator *)0x0) {
      this_00 = this->parser_;
      Namer::NamespacedType
                (&local_88,&(this->namer_).super_Namer,&this_00->current_namespace_->components,
                 &local_28->constant);
      this_local = (PythonStubGenerator *)Parser::LookupStruct(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return (StructDef *)this_local;
}

Assistant:

const StructDef *GetNestedStruct(const FieldDef *field) const {
    const Value *nested = field->attributes.Lookup("nested_flatbuffer");
    if (nested == nullptr) return nullptr;

    StructDef *nested_def = parser_.LookupStruct(nested->constant);
    if (nested_def != nullptr) return nested_def;

    return parser_.LookupStruct(namer_.NamespacedType(
        parser_.current_namespace_->components, nested->constant));
  }